

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O0

int __thiscall
MathML::AST::ArithmeticExpression::clone
          (ArithmeticExpression *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *pvVar2;
  value_type *__x;
  const_reference ppIVar3;
  size_t i;
  ArithmeticExpression *copy;
  ArithmeticExpression *in_stack_ffffffffffffffb0;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *this_00;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *local_30;
  
  pvVar1 = operator_new(0x28);
  ArithmeticExpression(in_stack_ffffffffffffffb0);
  *(Operator *)((long)pvVar1 + 0x20) = this->mOperator;
  local_30 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)0x0;
  while( true ) {
    this_00 = local_30;
    pvVar2 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
             std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size
                       (&this->mOperands);
    if (pvVar2 <= this_00) break;
    __x = (value_type *)((long)pvVar1 + 8);
    ppIVar3 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::at
                        (this_00,(size_type)__x);
    (*(*ppIVar3)->_vptr_INode[4])(*ppIVar3,(ulong)__fn & 0xffffffff);
    std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::push_back(this_00,__x)
    ;
    local_30 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
               ((long)&(local_30->
                       super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return (int)pvVar1;
}

Assistant:

INode* ArithmeticExpression::clone(CloneFlags cloneFlags) const
        {
            ArithmeticExpression* copy = new ArithmeticExpression();
            copy->mOperator = mOperator;
            for (size_t i=0; i<mOperands.size(); ++i)
            {
                copy->mOperands.push_back( mOperands.at( i )->clone(cloneFlags) );
            }
            return copy;
        }